

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hud.cpp
# Opt level: O2

void __thiscall CHud::RenderHealthAndAmmo(CHud *this,CNetObj_Character *pCharacter)

{
  long lVar1;
  IGraphics *pIVar2;
  IClient *pIVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  CQuadItem *pCVar7;
  CQuadItem *pCVar8;
  CQuadItem *pCVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  CQuadItem *pCVar15;
  long in_FS_OFFSET;
  CQuadItem Array [10];
  
  pCVar7 = Array;
  pCVar8 = Array;
  pCVar9 = Array;
  pCVar15 = Array;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (pCharacter != (CNetObj_Character *)0x0) {
    pIVar2 = ((this->super_CComponent).m_pClient)->m_pGraphics;
    (*(pIVar2->super_IInterface)._vptr_IInterface[0x13])
              (pIVar2,(ulong)(uint)g_pData->m_aImages[1].m_Id.m_Id);
    (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0xb])()
    ;
    (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])
              ();
    (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])
              (0x3f800000,0x3f800000,0x3f800000,0x3f800000);
    if (pCharacter->m_Weapon == 5) {
      pIVar3 = ((this->super_CComponent).m_pClient)->m_pClient;
      iVar4 = (pIVar3->m_GameTickSpeed * (g_pData->m_Weapons).m_Ninja.m_Duration) / 1000;
      iVar5 = pCharacter->m_AmmoCount - pIVar3->m_CurGameTick;
      iVar6 = iVar4;
      if (iVar5 < iVar4) {
        iVar6 = iVar5;
      }
      iVar10 = 0;
      if (-1 < iVar5) {
        iVar10 = iVar6;
      }
      RenderNinjaBar(this,5.0,29.0,(float)iVar10 / (float)iVar4);
    }
    else {
      CRenderTools::SelectSprite
                (&((this->super_CComponent).m_pClient)->m_RenderTools,
                 (g_pData->m_Weapons).m_aId[pCharacter->m_Weapon % 6].m_pSpriteProj,0,0,0);
      uVar11 = pCharacter->m_AmmoCount;
      if (9 < pCharacter->m_AmmoCount) {
        uVar11 = 10;
      }
      uVar14 = (ulong)uVar11;
      if ((int)uVar11 < 1) {
        uVar14 = 0;
      }
      if (pCharacter->m_Weapon == 3) {
        for (lVar12 = 0; uVar14 * 0xc - lVar12 != 0; lVar12 = lVar12 + 0xc) {
          pCVar7->m_X = (float)(int)lVar12 + 6.0;
          *(float *)((long)pCVar7 + 4) = 29.0;
          *(float *)((long)pCVar7 + 8) = 10.0;
          *(float *)((long)pCVar7 + 0xc) = 10.0;
          pCVar7 = (CQuadItem *)((long)pCVar7 + 0x10);
        }
      }
      else {
        for (lVar12 = 0; uVar14 * 0xc - lVar12 != 0; lVar12 = lVar12 + 0xc) {
          pCVar8->m_X = (float)(int)lVar12 + 5.0;
          *(float *)((long)pCVar8 + 4) = 29.0;
          *(float *)((long)pCVar8 + 8) = 12.0;
          *(float *)((long)pCVar8 + 0xc) = 12.0;
          pCVar8 = (CQuadItem *)((long)pCVar8 + 0x10);
        }
      }
      pIVar2 = ((this->super_CComponent).m_pClient)->m_pGraphics;
      (*(pIVar2->super_IInterface)._vptr_IInterface[0x1d])(pIVar2,Array);
    }
    uVar14 = 0;
    CRenderTools::SelectSprite(&((this->super_CComponent).m_pClient)->m_RenderTools,10,0,0,0);
    uVar11 = pCharacter->m_Health;
    if (9 < (int)uVar11) {
      uVar11 = 10;
    }
    uVar13 = (ulong)uVar11;
    if ((int)uVar11 < 1) {
      uVar13 = uVar14;
    }
    for (; uVar13 * 0xc - uVar14 != 0; uVar14 = uVar14 + 0xc) {
      pCVar9->m_X = (float)(int)uVar14 + 5.0;
      *(float *)((long)pCVar9 + 4) = 5.0;
      *(float *)((long)pCVar9 + 8) = 12.0;
      *(float *)((long)pCVar9 + 0xc) = 12.0;
      pCVar9 = (CQuadItem *)((long)pCVar9 + 0x10);
    }
    pIVar2 = ((this->super_CComponent).m_pClient)->m_pGraphics;
    (*(pIVar2->super_IInterface)._vptr_IInterface[0x1d])(pIVar2,Array,uVar13);
    CRenderTools::SelectSprite(&((this->super_CComponent).m_pClient)->m_RenderTools,0xb,0,0,0);
    iVar6 = (int)uVar13 * 0xc;
    for (uVar14 = 0; (uint)((10 - (int)uVar13) * 0x10) != uVar14; uVar14 = uVar14 + 0x10) {
      *(float *)((long)&Array[0].m_X + uVar14) = (float)iVar6 + 5.0;
      *(undefined8 *)((long)&Array[0].m_Y + uVar14) = 0x4140000040a00000;
      *(undefined4 *)((long)&Array[0].m_Height + uVar14) = 0x41400000;
      iVar6 = iVar6 + 0xc;
    }
    pIVar2 = ((this->super_CComponent).m_pClient)->m_pGraphics;
    (*(pIVar2->super_IInterface)._vptr_IInterface[0x1d])(pIVar2,Array);
    uVar14 = 0;
    CRenderTools::SelectSprite(&((this->super_CComponent).m_pClient)->m_RenderTools,0xc,0,0,0);
    uVar11 = pCharacter->m_Armor;
    if (9 < (int)uVar11) {
      uVar11 = 10;
    }
    uVar13 = (ulong)uVar11;
    if ((int)uVar11 < 1) {
      uVar13 = uVar14;
    }
    for (; uVar13 * 0xc - uVar14 != 0; uVar14 = uVar14 + 0xc) {
      pCVar15->m_X = (float)(int)uVar14 + 5.0;
      *(float *)((long)pCVar15 + 4) = 17.0;
      *(float *)((long)pCVar15 + 8) = 12.0;
      *(float *)((long)pCVar15 + 0xc) = 12.0;
      pCVar15 = (CQuadItem *)((long)pCVar15 + 0x10);
    }
    pIVar2 = ((this->super_CComponent).m_pClient)->m_pGraphics;
    (*(pIVar2->super_IInterface)._vptr_IInterface[0x1d])(pIVar2,Array,uVar13);
    CRenderTools::SelectSprite(&((this->super_CComponent).m_pClient)->m_RenderTools,0xd,0,0,0);
    uVar11 = 10 - (int)uVar13;
    iVar6 = (int)uVar13 * 0xc;
    for (uVar14 = 0; uVar11 * 0x10 != uVar14; uVar14 = uVar14 + 0x10) {
      *(float *)((long)&Array[0].m_X + uVar14) = (float)iVar6 + 5.0;
      *(undefined8 *)((long)&Array[0].m_Y + uVar14) = 0x4140000041880000;
      *(undefined4 *)((long)&Array[0].m_Height + uVar14) = 0x41400000;
      iVar6 = iVar6 + 0xc;
    }
    pIVar2 = ((this->super_CComponent).m_pClient)->m_pGraphics;
    (*(pIVar2->super_IInterface)._vptr_IInterface[0x1d])(pIVar2,Array,(ulong)uVar11);
    (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])
              ();
    (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[10])();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CHud::RenderHealthAndAmmo(const CNetObj_Character *pCharacter)
{
	if(!pCharacter)
		return;

	float x = 5;
	float y = 5;
	int i;
	IGraphics::CQuadItem Array[10];

	Graphics()->TextureSet(g_pData->m_aImages[IMAGE_GAME].m_Id);
	Graphics()->WrapClamp();

	Graphics()->QuadsBegin();
	Graphics()->SetColor(1.0f, 1.0f, 1.0f, 1.0f);

	// render ammo
	if(pCharacter->m_Weapon == WEAPON_NINJA)
	{
		const int Max = g_pData->m_Weapons.m_Ninja.m_Duration * Client()->GameTickSpeed() / 1000;
		float NinjaProgress = clamp(pCharacter->m_AmmoCount-Client()->GameTick(), 0, Max) / (float)Max;
		RenderNinjaBar(x, y+24.f, NinjaProgress);
	}
	else
	{
		RenderTools()->SelectSprite(g_pData->m_Weapons.m_aId[pCharacter->m_Weapon%NUM_WEAPONS].m_pSpriteProj);
		if(pCharacter->m_Weapon == WEAPON_GRENADE)
		{
			for(i = 0; i < minimum(pCharacter->m_AmmoCount, 10); i++)
				Array[i] = IGraphics::CQuadItem(x+1+i*12, y+24, 10, 10);
		}
		else
		{
			for(i = 0; i < minimum(pCharacter->m_AmmoCount, 10); i++)
				Array[i] = IGraphics::CQuadItem(x+i*12, y+24, 12, 12);
		}
		Graphics()->QuadsDrawTL(Array, i);
	}

	int h = 0;

	// render health
	RenderTools()->SelectSprite(SPRITE_HEALTH_FULL);
	for(; h < minimum(pCharacter->m_Health, 10); h++)
		Array[h] = IGraphics::CQuadItem(x+h*12,y,12,12);
	Graphics()->QuadsDrawTL(Array, h);

	i = 0;
	RenderTools()->SelectSprite(SPRITE_HEALTH_EMPTY);
	for(; h < 10; h++)
		Array[i++] = IGraphics::CQuadItem(x+h*12,y,12,12);
	Graphics()->QuadsDrawTL(Array, i);

	// render armor meter
	h = 0;
	RenderTools()->SelectSprite(SPRITE_ARMOR_FULL);
	for(; h < minimum(pCharacter->m_Armor, 10); h++)
		Array[h] = IGraphics::CQuadItem(x+h*12,y+12,12,12);
	Graphics()->QuadsDrawTL(Array, h);

	i = 0;
	RenderTools()->SelectSprite(SPRITE_ARMOR_EMPTY);
	for(; h < 10; h++)
		Array[i++] = IGraphics::CQuadItem(x+h*12,y+12,12,12);
	Graphics()->QuadsDrawTL(Array, i);
	Graphics()->QuadsEnd();
	Graphics()->WrapNormal();
}